

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O1

DefinitionSymbol * __thiscall
slang::ast::Compilation::getDefinition
          (Compilation *this,ConfigBlockSymbol *config,string_view cellName,string_view libName,
          SourceRange sourceRange)

{
  group_type_pointer pgVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  RootSymbol *pRVar3;
  group_type_pointer pgVar4;
  value_type_pointer ppVar5;
  ulong uVar6;
  pointer ppSVar7;
  DefinitionSymbol *pDVar8;
  SourceLibrary *pSVar9;
  uint uVar10;
  undefined1 auVar11 [16];
  uchar uVar12;
  uchar uVar13;
  uchar uVar14;
  uchar uVar15;
  bool bVar16;
  int iVar17;
  SourceLibrary *pSVar18;
  Diagnostic *this_00;
  uint uVar19;
  char *__s;
  size_type __len2;
  ulong uVar20;
  long lVar21;
  value_type_pointer unaff_RBX;
  value_type_pointer __u;
  size_t __n;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 __s1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aVar22;
  DefinitionSymbol *pDVar23;
  pointer ppSVar24;
  ulong uVar25;
  undefined1 auVar26 [16];
  format_args args;
  string_view fmt;
  string errorName;
  string local_78;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_58;
  size_type local_50;
  char *local_48;
  size_type local_40;
  
  __s = cellName._M_str;
  __len2 = cellName._M_len;
  __s1 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)libName._M_str;
  __n = libName._M_len;
  pRVar3 = (this->root)._M_t.
           super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
           ._M_t.
           super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
           .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
  local_58.values_ = (value<fmt::v11::context> *)&pRVar3->super_Scope;
  if (pRVar3 == (RootSymbol *)0x0) {
    local_58.values_ = (value<fmt::v11::context> *)0x0;
  }
  errorName._M_dataplus._M_p = (pointer)0x0;
  aVar22 = __s1;
  local_50 = __len2;
  local_48 = __s;
  slang::detail::hashing::
  HashValueImpl<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_1UL>
  ::apply((size_t *)&errorName,
          (tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*> *
          )&local_58);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = errorName._M_dataplus._M_p;
  uVar25 = SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar11,8) ^
           SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar11,0);
  uVar20 = uVar25 >> ((byte)(this->definitionMap).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
                            .arrays.groups_size_index & 0x3f);
  lVar21 = (uVar25 & 0xff) * 4;
  uVar12 = (&UNK_0051605c)[lVar21];
  uVar13 = (&UNK_0051605d)[lVar21];
  uVar14 = (&UNK_0051605e)[lVar21];
  uVar15 = (&UNK_0051605f)[lVar21];
  pDVar23 = (DefinitionSymbol *)(ulong)((uint)uVar25 & 7);
  uVar25 = 0;
  do {
    pgVar4 = (this->definitionMap).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
             .arrays.groups_;
    pgVar1 = pgVar4 + uVar20;
    auVar26[0] = -(pgVar1->m[0].n == uVar12);
    auVar26[1] = -(pgVar1->m[1].n == uVar13);
    auVar26[2] = -(pgVar1->m[2].n == uVar14);
    auVar26[3] = -(pgVar1->m[3].n == uVar15);
    auVar26[4] = -(pgVar1->m[4].n == uVar12);
    auVar26[5] = -(pgVar1->m[5].n == uVar13);
    auVar26[6] = -(pgVar1->m[6].n == uVar14);
    auVar26[7] = -(pgVar1->m[7].n == uVar15);
    auVar26[8] = -(pgVar1->m[8].n == uVar12);
    auVar26[9] = -(pgVar1->m[9].n == uVar13);
    auVar26[10] = -(pgVar1->m[10].n == uVar14);
    auVar26[0xb] = -(pgVar1->m[0xb].n == uVar15);
    auVar26[0xc] = -(pgVar1->m[0xc].n == uVar12);
    auVar26[0xd] = -(pgVar1->m[0xd].n == uVar13);
    auVar26[0xe] = -(pgVar1->m[0xe].n == uVar14);
    auVar26[0xf] = -(pgVar1->m[0xf].n == uVar15);
    uVar19 = (uint)(ushort)((ushort)(SUB161(auVar26 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar26 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar26 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar26 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar26 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar26 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar26 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar26 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar26 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar26 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar26 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar26 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar26 >> 0x77,0) & 1) << 0xe);
    if (uVar19 != 0) {
      ppVar5 = (this->definitionMap).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
               .arrays.elements_;
      do {
        uVar10 = 0;
        if (uVar19 != 0) {
          for (; (uVar19 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
          }
        }
        __u = ppVar5 + uVar20 * 0xf + (ulong)uVar10;
        bVar16 = std::
                 __tuple_compare<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_0UL,_2UL>
                 ::__eq((tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                         *)&local_58,&__u->first);
        if (bVar16) goto LAB_0014714b;
        uVar19 = uVar19 - 1 & uVar19;
      } while (uVar19 != 0);
      __u = unaff_RBX;
      if (bVar16) goto LAB_0014714b;
    }
    if ((pgVar4[uVar20].m[0xf].n & pDVar23[0x1c01].parameters.stackBase[0xb0]) == 0) break;
    uVar6 = (this->definitionMap).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
            .arrays.groups_size_mask;
    lVar21 = uVar20 + uVar25;
    uVar25 = uVar25 + 1;
    uVar20 = lVar21 + 1U & uVar6;
  } while (uVar25 <= uVar6);
  __u = (value_type_pointer)0x0;
LAB_0014714b:
  bVar16 = true;
  if (__u != (value_type_pointer)0x0) {
    ppSVar24 = (__u->second).first.
               super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    ppSVar7 = (__u->second).first.
              super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppSVar24 == ppSVar7) {
      pDVar23 = (DefinitionSymbol *)0x0;
    }
    else {
      pDVar23 = (DefinitionSymbol *)0x0;
      do {
        pDVar8 = (DefinitionSymbol *)*ppSVar24;
        if ((pDVar8->super_Symbol).kind == Definition) {
          pSVar9 = pDVar8->sourceLibrary;
          if (((pSVar9->name)._M_string_length == __n) &&
             ((__n == 0 ||
              (iVar17 = bcmp(__s1.values_,(pSVar9->name)._M_dataplus._M_p,__n), iVar17 == 0)))) {
            iVar17 = 2;
          }
          else {
            if (__n == 0) {
              pSVar18 = Symbol::getSourceLibrary(&config->super_Symbol);
              iVar17 = 2;
              if (pSVar9 == pSVar18) goto LAB_001471c9;
            }
            iVar17 = 0;
            pDVar8 = pDVar23;
          }
        }
        else {
          iVar17 = 3;
          pDVar8 = pDVar23;
        }
LAB_001471c9:
        pDVar23 = pDVar8;
      } while (((iVar17 == 3) || (iVar17 == 0)) && (ppSVar24 = ppSVar24 + 1, ppSVar24 != ppSVar7));
    }
    if ((pDVar23 == (DefinitionSymbol *)0x0) || ((pDVar23->definitionKind & ~Program) != Module)) {
      bVar16 = true;
    }
    else {
      bVar16 = false;
    }
  }
  if (bVar16) {
    paVar2 = &errorName.field_2;
    errorName._M_string_length = 0;
    errorName.field_2._M_local_buf[0] = '\0';
    errorName._M_dataplus._M_p = (pointer)paVar2;
    if (__n == 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                (&errorName,0,0,__s,__len2);
    }
    else {
      args.field_1.args_ = aVar22.args_;
      args.desc_ = (unsigned_long_long)&local_58;
      fmt.size_ = 0xdd;
      fmt.data_ = (char *)0x5;
      local_58 = __s1;
      local_50 = __n;
      local_48 = __s;
      local_40 = __len2;
      ::fmt::v11::vformat_abi_cxx11_(&local_78,(v11 *)0x529d6a,fmt,args);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&errorName,&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
    }
    this_00 = Scope::addDiag(&((this->root)._M_t.
                               super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
                               .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl)
                              ->super_Scope,(DiagCode)0x10000d,sourceRange);
    Diagnostic::operator<<(this_00,&errorName);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)errorName._M_dataplus._M_p != paVar2) {
      operator_delete(errorName._M_dataplus._M_p,
                      CONCAT71(errorName.field_2._M_allocated_capacity._1_7_,
                               errorName.field_2._M_local_buf[0]) + 1);
    }
    pDVar23 = (DefinitionSymbol *)0x0;
  }
  return pDVar23;
}

Assistant:

const DefinitionSymbol* Compilation::getDefinition(const ConfigBlockSymbol& config,
                                                   std::string_view cellName,
                                                   std::string_view libName,
                                                   SourceRange sourceRange) const {
    if (auto defIt = definitionMap.find(std::tuple{cellName, root.get()});
        defIt != definitionMap.end()) {

        const DefinitionSymbol* foundDef = nullptr;
        for (auto defSym : defIt->second.first) {
            if (defSym->kind != SymbolKind::Definition)
                continue;

            auto& def = defSym->as<DefinitionSymbol>();
            if (def.sourceLibrary.name == libName ||
                (libName.empty() && &def.sourceLibrary == config.getSourceLibrary())) {
                foundDef = &def;
                break;
            }
        }

        if (foundDef && (foundDef->definitionKind == DefinitionKind::Module ||
                         foundDef->definitionKind == DefinitionKind::Program)) {
            return foundDef;
        }
    }

    std::string errorName;
    if (!libName.empty())
        errorName = fmt::format("{}.{}", libName, cellName);
    else
        errorName = cellName;

    root->addDiag(diag::InvalidTopModule, sourceRange) << errorName;
    return nullptr;
}